

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O3

HalfCycles __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::perform_machine_cycle
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true> *this,
          PartialMachineCycle *cycle)

{
  TMS9918<(TI::TMS::Personality)0> *this_00;
  atomic_flag *paVar1;
  HalfCycles *pHVar2;
  HandledSlot *this_01;
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>,_false,_false>
  *this_02;
  __uniq_ptr_data<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>,_true,_true>
  this_03;
  __atomic_flag_data_type _Var3;
  uint8_t uVar4;
  uchar uVar5;
  _Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_> _Var6;
  IntType IVar7;
  pointer pcVar8;
  ulong uVar9;
  bool bVar10;
  byte bVar11;
  long lVar12;
  long lVar13;
  uint8_t *puVar14;
  ssize_t sVar15;
  MemorySlot *pMVar16;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar17;
  uint8_t *puVar18;
  ulong uVar19;
  uint16_t uVar20;
  int iVar21;
  int iVar22;
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> _Var23;
  uint *puVar24;
  Operation OVar25;
  uint uVar26;
  ushort uVar27;
  long lVar28;
  pointer *__ptr;
  WrappedInt<HalfCycles> WVar29;
  uint uVar30;
  HalfCycles HVar31;
  int iVar32;
  ulong uVar33;
  unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
  uVar34;
  FileSpeed tape_speed;
  undefined1 local_58 [16];
  __uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_> local_48;
  _Head_base<0UL,_Outputs::CRT::Flywheel_*,_false> local_40;
  PartialMachineCycle *local_38;
  
  OVar25 = cycle->operation;
  WVar29.length_._4_4_ = 0;
  WVar29.length_._0_4_ = (uint)(OVar25 == ReadOpcode) * 2;
  lVar28 = (cycle->length).super_WrappedInt<HalfCycles>.length_ + WVar29.length_;
  HVar31.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)
       ((this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ + lVar28);
  (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ =
       (IntType)HVar31.super_WrappedInt<HalfCycles>.length_;
  (this->vdp_).is_flushed_ = false;
  lVar13 = (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_;
  lVar12 = lVar13 - lVar28;
  (this->vdp_).time_until_event_.super_WrappedInt<HalfCycles>.length_ = lVar12;
  if (lVar12 == 0 || lVar13 < lVar28) {
    (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_ = lVar12;
    (this->vdp_).is_flushed_ = true;
    (this->vdp_).did_flush_ = true;
    (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
    this_00 = &(this->vdp_).object_;
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_00,HVar31);
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
    update_sequence_point(&this->vdp_);
    LOCK();
    paVar1 = &(this->vdp_).flush_concurrency_check_;
    _Var3 = (paVar1->super___atomic_flag_base)._M_i;
    (paVar1->super___atomic_flag_base)._M_i = true;
    UNLOCK();
    if (_Var3 != false) {
      __assert_fail("!flush_concurrency_check_.test_and_set()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/MSX/../../ClockReceiver/JustInTime.hpp"
                    ,0x7e,
                    "auto JustInTimeActor<TI::TMS::TMS9918<TI::TMS::TMS9918A>>::operator->() [T = TI::TMS::TMS9918<TI::TMS::TMS9918A>, LocalTimeScale = HalfCycles, multiplier = 1, divider = 1]"
                   );
    }
    if ((this->vdp_).is_flushed_ == false) {
      (this->vdp_).is_flushed_ = true;
      (this->vdp_).did_flush_ = true;
      HVar31.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)
           (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_;
      (this->vdp_).time_since_update_.super_WrappedInt<HalfCycles>.length_ = 0;
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::run_for(this_00,HVar31);
    }
    LOCK();
    (this->vdp_).flush_concurrency_check_.super___atomic_flag_base._M_i = false;
    UNLOCK();
    local_58._0_8_ = &this->vdp_;
    local_58._8_8_ = this_00;
    bVar10 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line(this_00);
    if ((this->z80_).super_ProcessorBase.super_ProcessorStorage.irq_line_ != bVar10) {
      lVar13 = (this->vdp_).time_overrun_.super_WrappedInt<HalfCycles>.length_;
      (this->z80_).super_ProcessorBase.super_ProcessorStorage.irq_line_ = bVar10;
      if ((bVar10) && ((this->z80_).super_ProcessorBase.super_ProcessorStorage.iff1_ == true)) {
        puVar14 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
        *puVar14 = *puVar14 | 1;
        bVar11 = 1;
      }
      else {
        puVar14 = &(this->z80_).super_ProcessorBase.super_ProcessorStorage.request_status_;
        *puVar14 = *puVar14 & 0xfe;
        bVar11 = 0;
      }
      if (lVar13 < -1) {
        (this->z80_).super_ProcessorBase.super_ProcessorStorage.last_request_status_ =
             (this->z80_).super_ProcessorBase.super_ProcessorStorage.last_request_status_ & 0xfe |
             bVar11;
      }
    }
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)local_58);
    OVar25 = cycle->operation;
  }
  lVar13 = (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ + lVar28;
  (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar13;
  pHVar2 = &this->memory_slots_[0].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar28;
  pHVar2 = &this->memory_slots_[1].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar28;
  pHVar2 = &this->memory_slots_[2].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar28;
  pHVar2 = &this->memory_slots_[3].cycles_since_update;
  (pHVar2->super_WrappedInt<HalfCycles>).length_ =
       (pHVar2->super_WrappedInt<HalfCycles>).length_ + lVar28;
  if (8 < (int)OVar25) goto switchD_0034479c_caseD_9a;
  if (cycle->address == (ushort *)0x0) {
    _Var23._M_head_impl = (Flywheel *)0x0;
  }
  else {
    _Var23._M_head_impl._2_6_ = 0;
    _Var23._M_head_impl._0_2_ = *cycle->address;
  }
  if (Interrupt < OVar25) goto switchD_0034479c_caseD_9a;
  this_01 = this->memory_slots_;
  uVar20 = (uint16_t)_Var23._M_head_impl;
  uVar30 = (uint)_Var23._M_head_impl;
  switch(OVar25) {
  case ReadOpcode:
    if (this->use_fast_tape_ == true) {
      if (uVar20 == 0) {
LAB_003449f9:
        this->pc_zero_accesses_ = this->pc_zero_accesses_ + 1;
      }
      else {
        if (uVar30 == 0x1abc) {
          puVar14 = ram(this);
          local_58[0] = (Parser)puVar14[0xfca4];
          puVar14 = ram(this);
          local_58[1] = puVar14[0xfca5];
          iVar21 = Storage::Tape::MSX::Parser::get_byte((FileSpeed *)local_58,&this->tape_player_);
          if (iVar21 >= 0) {
            CPU::Z80::ProcessorBase::set_value_of
                      (&(this->z80_).super_ProcessorBase,A,(uint16_t)iVar21);
          }
          CPU::Z80::ProcessorBase::set_value_of
                    (&(this->z80_).super_ProcessorBase,Flags,(ushort)(iVar21 < 0));
          *cycle->value = 0xc9;
          break;
        }
        if (uVar30 == 0x1a63) {
          puVar14 = (this->i8255_).outputs_ + 2;
          *puVar14 = *puVar14 & 0xef;
          Intel::i8255::
          i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
          ::update_outputs(&this->i8255_);
          this_02 = &this->z80_;
          CPU::Z80::ProcessorBase::set_value_of(&this_02->super_ProcessorBase,IFF1,0);
          CPU::Z80::ProcessorBase::set_value_of(&this_02->super_ProcessorBase,IFF2,0);
          Storage::Tape::MSX::Parser::find_header((Parser *)local_58,&this->tape_player_);
          bVar10 = (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   local_58._0_8_ ==
                   (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                   0x0;
          if (!bVar10) {
            uVar4 = *(uint8_t *)local_58._0_8_;
            puVar14 = ram(this);
            puVar14[0xfca4] = uVar4;
            uVar4 = *(uint8_t *)(local_58._0_8_ + 1);
            puVar14 = ram(this);
            puVar14[0xfca5] = uVar4;
          }
          CPU::Z80::ProcessorBase::set_value_of(&this_02->super_ProcessorBase,Flags,(ushort)bVar10);
          *cycle->value = 0xc9;
          if ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
              local_58._0_8_ !=
              (JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)0x0) {
            operator_delete((void *)local_58._0_8_,2);
          }
          break;
        }
      }
    }
    else if (uVar20 == 0) goto LAB_003449f9;
    this->pc_address_ = uVar20;
  case Read:
    if ((uVar20 == 0xffff) &&
       ((this->final_slot_->super_PrimarySlot).supports_secondary_paging == true)) {
      bVar11 = PrimarySlot::secondary_paging(&this->final_slot_->super_PrimarySlot);
      bVar11 = ~bVar11;
    }
    else if (this->read_pointers_[(ulong)_Var23._M_head_impl >> 0xd] == (uint8_t *)0x0) {
      uVar30 = this->primary_slots_ >> ((byte)((ulong)_Var23._M_head_impl >> 0xd) & 6) & 3;
      _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
           this->memory_slots_[uVar30].handler._M_t.
           super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
           .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
      IVar7 = this->memory_slots_[uVar30].cycles_since_update.super_WrappedInt<HalfCycles>.length_;
      this->memory_slots_[uVar30].cycles_since_update.super_WrappedInt<HalfCycles>.length_ = 0;
      (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                            _M_head_impl + 0x10))
                (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,IVar7);
      _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
           this->memory_slots_[uVar30].handler._M_t.
           super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
           ._M_t.
           super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
           .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
      bVar11 = (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                                     _M_head_impl + 0x20))
                         (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,
                          _Var23._M_head_impl);
    }
    else {
      bVar11 = this->read_pointers_[(ulong)_Var23._M_head_impl >> 0xd][uVar30 & 0x1fff];
    }
LAB_00344a91:
    *cycle->value = bVar11;
    break;
  case Write:
    if ((uVar20 == 0xffff) &&
       ((this->final_slot_->super_PrimarySlot).supports_secondary_paging == true)) {
      PrimarySlot::set_secondary_paging(&this->final_slot_->super_PrimarySlot,*cycle->value);
      update_paging(this);
    }
    else {
      uVar26 = this->primary_slots_ >> ((byte)((ulong)_Var23._M_head_impl >> 0xd) & 6) & 3;
      if ((MemorySlotHandler *)
          this->memory_slots_[uVar26].handler._M_t.
          super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
          ._M_t.
          super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
          .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false> == (MemorySlotHandler *)0x0) {
        this->write_pointers_[(ulong)_Var23._M_head_impl >> 0xd][uVar30 & 0x1fff] = *cycle->value;
      }
      else {
        lVar12 = lVar13 + 3;
        if (-1 < lVar13) {
          lVar12 = lVar13;
        }
        (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar13 % 4;
        local_40._M_head_impl = _Var23._M_head_impl;
        Outputs::Speaker::
        PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
        ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar12 >> 2));
        _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
             this_01[uVar26].handler._M_t.
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
        IVar7 = this_01[uVar26].cycles_since_update.super_WrappedInt<HalfCycles>.length_;
        this_01[uVar26].cycles_since_update.super_WrappedInt<HalfCycles>.length_ = 0;
        (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                              _M_head_impl + 0x10))
                  (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,IVar7);
        _Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
             this_01[uVar26].handler._M_t.
             super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
             .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>;
        local_48._M_t.
        super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
        .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl._0_4_ =
             (uint)*cycle->value;
        uVar30 = (uint)(this->pc_address_ >> 0xd);
        puVar14 = this->read_pointers_[uVar30];
        puVar18 = PrimarySlot::read_pointer(&this_01->super_PrimarySlot,uVar30);
        (**(code **)(*(long *)_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>.
                              _M_head_impl + 0x18))
                  (_Var6.super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl,
                   local_40._M_head_impl,
                   (ulong)local_48._M_t.
                          super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                          .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl &
                   0xffffffff,puVar14 != puVar18);
      }
    }
    break;
  case Input:
    uVar26 = uVar30 & 0xff;
    if (0x13 < uVar26 - 0x98) {
      if (uVar26 == 0xb5) break;
switchD_0034480f_caseD_9c:
      *cycle->value = 0xff;
      break;
    }
    puVar24 = &switchD_0034480f::switchdataD_004c73c4;
    switch(uVar26) {
    case 0x98:
    case 0x99:
      uVar34 = JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::
               operator->((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>
                           *)local_58);
      sVar15 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::read
                         ((TMS9918<(TI::TMS::Personality)0> *)local_58._8_8_,uVar30,
                          uVar34._M_t.
                          super___uniq_ptr_impl<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                          .super__Head_base<0UL,_TI::TMS::TMS9918<(TI::TMS::Personality)0>_*,_false>
                          ._M_head_impl,(size_t)puVar24);
      *cycle->value = (uint8_t)sVar15;
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_58);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_58);
      bVar10 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                         ((TMS9918<(TI::TMS::Personality)0> *)local_58._8_8_);
      goto LAB_00344cde;
    case 0x9a:
    case 0x9b:
      goto switchD_0034479c_caseD_9a;
    default:
      goto switchD_0034480f_caseD_9c;
    case 0xa2:
      lVar12 = lVar13 + 3;
      if (-1 < lVar13) {
        lVar12 = lVar13;
      }
      (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar13 % 4;
      Outputs::Speaker::
      PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
      ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar12 >> 2));
      bVar11 = GI::AY38910::Utility::read<GI::AY38910::AY38910<false>>(&(this->speaker_).ay);
      break;
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
      sVar15 = Intel::i8255::
               i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>
               ::read(&this->i8255_,uVar30,
                      (void *)((long)&switchD_0034480f::switchdataD_004c73c4 +
                              (long)(int)(&switchD_0034480f::switchdataD_004c73c4)[uVar26 - 0x98]),
                      0x4c73c4);
      bVar11 = (byte)sVar15;
    }
    goto LAB_00344a91;
  case Output:
    uVar26 = uVar30 & 0xff;
    puVar24 = &switchD_0034479c::switchdataD_004c734c;
    switch(uVar26) {
    case 0x98:
    case 0x99:
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_58);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::write
                ((TMS9918<(TI::TMS::Personality)0> *)local_58._8_8_,uVar30,
                 (void *)(ulong)*cycle->value,(size_t)puVar24);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_58);
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 local_58);
      bVar10 = TI::TMS::TMS9918<(TI::TMS::Personality)0>::get_interrupt_line
                         ((TMS9918<(TI::TMS::Personality)0> *)local_58._8_8_);
LAB_00344cde:
      CPU::Z80::ProcessorBase::set_interrupt_line
                (&(this->z80_).super_ProcessorBase,bVar10,(HalfCycles)0x0);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)local_58);
      break;
    case 0x9a:
    case 0x9b:
    case 0xb4:
    case 0xb5:
      break;
    case 0xa0:
    case 0xa1:
      lVar12 = lVar13 + 3;
      if (-1 < lVar13) {
        lVar12 = lVar13;
      }
      (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = lVar13 % 4;
      Outputs::Speaker::
      PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC,_Yamaha::OPL::OPLL>_>
      ::run_for(&(this->speaker_).speaker,&(this->speaker_).audio_queue,(Cycles)(lVar12 >> 2));
      GI::AY38910::Utility::write<GI::AY38910::AY38910<false>>
                (&(this->speaker_).ay,(uVar30 & 0xff) == 0xa1,*cycle->value);
      break;
    case 0xa8:
    case 0xa9:
    case 0xaa:
    case 0xab:
      Intel::i8255::
      i8255<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_true>::i8255PortHandler>::
      write(&this->i8255_,uVar30,(void *)(ulong)*cycle->value,0x4c734c);
      break;
    default:
      if (uVar26 - 0xfc < 4) break;
      if (uVar26 - 0x7c < 2) {
        if (((ulong)_Var23._M_head_impl & 1) == 0) {
          (this->speaker_).opll.super_OPLBase<Yamaha::OPL::OPLL,_false>.selected_register_ =
               *cycle->value;
        }
        else {
          Yamaha::OPL::OPLL::write_register
                    (&(this->speaker_).opll,
                     (this->speaker_).opll.super_OPLBase<Yamaha::OPL::OPLL,_false>.
                     selected_register_,*cycle->value);
        }
        break;
      }
    case 0x9c:
    case 0x9d:
    case 0x9e:
    case 0x9f:
    case 0xa2:
    case 0xa3:
    case 0xa4:
    case 0xa5:
    case 0xa6:
    case 0xa7:
    case 0xac:
    case 0xad:
    case 0xae:
    case 0xaf:
    case 0xb0:
    case 0xb1:
    case 0xb2:
    case 0xb3:
      printf("Unhandled write %02x of %02x\n",(ulong)(uVar30 & 0xff),(ulong)*cycle->value);
    }
    break;
  case Interrupt:
    *cycle->value = 0xff;
    if ((this->input_text_)._M_string_length == 0) break;
    this_03.
    super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>._M_t
    .super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
    super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl =
         (__uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>)
         (this->memory_slots_ + 3);
    pMVar16 = PrimarySlot::subslot
                        ((PrimarySlot *)
                         this_03.
                         super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                         .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
    pvVar17 = MemorySlot::source(pMVar16);
    local_48._M_t.
    super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
    super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl._1_7_ = 0;
    local_48._M_t.
    super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>.
    super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl._0_1_ =
         (pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start[0xf3fa];
    pMVar16 = PrimarySlot::subslot
                        ((PrimarySlot *)
                         this_03.
                         super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                         .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
    pvVar17 = MemorySlot::source(pMVar16);
    bVar11 = (pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start[0xf3fb];
    pMVar16 = PrimarySlot::subslot
                        ((PrimarySlot *)
                         this_03.
                         super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                         .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
    pvVar17 = MemorySlot::source(pMVar16);
    uVar5 = (pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[0xf3f8];
    local_40._M_head_impl =
         (Flywheel *)
         this_03.
         super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
         ._M_t.
         super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
         .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl;
    pMVar16 = PrimarySlot::subslot
                        ((PrimarySlot *)
                         this_03.
                         super___uniq_ptr_impl<Outputs::CRT::Flywheel,_std::default_delete<Outputs::CRT::Flywheel>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                         .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl,0);
    pvVar17 = MemorySlot::source(pMVar16);
    uVar27 = CONCAT11((pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start[0xf3f9],uVar5);
    uVar19 = (this->input_text_)._M_string_length;
    if (uVar19 == 0) {
LAB_00344b7e:
      pcVar8 = (this->input_text_)._M_dataplus._M_p;
      (this->input_text_)._M_string_length = 0;
      *pcVar8 = '\0';
    }
    else {
      iVar32 = (int)local_48._M_t.
                    super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                    .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl +
               (uint)bVar11 * 0x100 + -0xfbf0;
      iVar21 = (int)(uVar27 - 0xfbef) % 0x28;
      local_48._M_t.
      super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
      .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>._M_head_impl._0_4_ = iVar32;
      if (iVar21 == iVar32) {
        uVar33 = 0;
      }
      else {
        uVar9 = 1;
        iVar32 = uVar27 - 0xfbf0;
        local_38 = cycle;
        do {
          iVar22 = iVar21;
          uVar33 = uVar9;
          uVar5 = (this->input_text_)._M_dataplus._M_p[uVar33 - 1];
          pMVar16 = PrimarySlot::subslot((PrimarySlot *)local_40._M_head_impl,0);
          pvVar17 = MemorySlot::source(pMVar16);
          (pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[(long)iVar32 + 0xfbf0] = uVar5;
          uVar19 = (this->input_text_)._M_string_length;
          if (uVar19 <= uVar33) break;
          iVar21 = (iVar22 + 1) % 0x28;
          uVar9 = uVar33 + 1;
          iVar32 = iVar22;
        } while (iVar21 != (uint)local_48._M_t.
                                 super__Tuple_impl<0UL,_Outputs::CRT::Flywheel_*,_std::default_delete<Outputs::CRT::Flywheel>_>
                                 .super__Head_base<0UL,_Outputs::CRT::Flywheel_*,_false>.
                                 _M_head_impl);
        uVar27 = (short)iVar22 - 0x410;
        cycle = local_38;
      }
      if (uVar19 == uVar33) goto LAB_00344b7e;
      std::__cxx11::string::_M_erase((ulong)&this->input_text_,0);
    }
    _Var23._M_head_impl = local_40._M_head_impl;
    pMVar16 = PrimarySlot::subslot((PrimarySlot *)local_40._M_head_impl,0);
    pvVar17 = MemorySlot::source(pMVar16);
    (pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[0xf3f8] = (uchar)uVar27;
    pMVar16 = PrimarySlot::subslot((PrimarySlot *)_Var23._M_head_impl,0);
    pvVar17 = MemorySlot::source(pMVar16);
    (pvVar17->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_start[0xf3f9] = (uchar)(uVar27 >> 8);
  }
switchD_0034479c_caseD_9a:
  if (this->tape_player_is_sleeping_ == false) {
    Storage::Tape::BinaryTapePlayer::run_for
              (&this->tape_player_,
               (Cycles)(long)(int)(cycle->length).super_WrappedInt<HalfCycles>.length_);
  }
  return (HalfCycles)(WrappedInt<HalfCycles>)WVar29.length_;
}

Assistant:

forceinline HalfCycles perform_machine_cycle(const CPU::Z80::PartialMachineCycle &cycle) {
			// Per the best information I currently have, the MSX inserts an extra cycle into each opcode read,
			// but otherwise runs without pause.
			const HalfCycles addition((cycle.operation == CPU::Z80::PartialMachineCycle::ReadOpcode) ? 2 : 0);
			const HalfCycles total_length = addition + cycle.length;
			if(vdp_ += total_length) {
				z80_.set_interrupt_line(vdp_->get_interrupt_line(), vdp_.last_sequence_point_overrun());
			}
			time_since_ay_update_ += total_length;
			memory_slots_[0].cycles_since_update += total_length;
			memory_slots_[1].cycles_since_update += total_length;
			memory_slots_[2].cycles_since_update += total_length;
			memory_slots_[3].cycles_since_update += total_length;

			if constexpr (model >= Target::Model::MSX2) {
				clock_.run_for(total_length);
			}

			if(cycle.is_terminal()) {
				uint16_t address = cycle.address ? *cycle.address : 0x0000;
				switch(cycle.operation) {
					case CPU::Z80::PartialMachineCycle::ReadOpcode:
						if(use_fast_tape_) {
							if(address == 0x1a63) {
								// TAPION

								// Enable the tape motor.
								i8255_.write(0xab, 0x8);

								// Disable interrupts.
								z80_.set_value_of(CPU::Z80::Register::IFF1, 0);
								z80_.set_value_of(CPU::Z80::Register::IFF2, 0);

								// Use the parser to find a header, and if one is found then populate
								// LOWLIM and WINWID, and reset carry. Otherwise set carry.
								using Parser = Storage::Tape::MSX::Parser;
								std::unique_ptr<Parser::FileSpeed> new_speed = Parser::find_header(tape_player_);
								if(new_speed) {
									ram()[0xfca4] = new_speed->minimum_start_bit_duration;
									ram()[0xfca5] = new_speed->low_high_disrimination_duration;
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}

							if(address == 0x1abc) {
								// TAPIN

								// Grab the current values of LOWLIM and WINWID.
								using Parser = Storage::Tape::MSX::Parser;
								Parser::FileSpeed tape_speed;
								tape_speed.minimum_start_bit_duration = ram()[0xfca4];
								tape_speed.low_high_disrimination_duration = ram()[0xfca5];

								// Ask the tape parser to grab a byte.
								int next_byte = Parser::get_byte(tape_speed, tape_player_);

								// If a byte was found, return it with carry unset. Otherwise set carry to
								// indicate error.
								if(next_byte >= 0) {
									z80_.set_value_of(CPU::Z80::Register::A, uint16_t(next_byte));
									z80_.set_value_of(CPU::Z80::Register::Flags, 0);
								} else {
									z80_.set_value_of(CPU::Z80::Register::Flags, 1);
								}

								// RET.
								*cycle.value = 0xc9;
								break;
							}
						}

						if(!address) {
							pc_zero_accesses_++;
						}

						// TODO: below relates to confidence measurements. Reinstate, somehow.
//						if(is_unpopulated_[address >> 13] == unpopulated_) {
//							performed_unmapped_access_ = true;
//						}

						pc_address_ = address;	// This is retained so as to be able to name the source of an access to cartridge handlers.
						[[fallthrough]];

					case CPU::Z80::PartialMachineCycle::Read:
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							*cycle.value = final_slot_->secondary_paging() ^ 0xff;
							break;
						}

						if(read_pointers_[address >> 13]) {
							*cycle.value = read_pointers_[address >> 13][address & 8191];
						} else {
							const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							*cycle.value = memory_slots_[slot_hit].handler->read(address);
						}
					break;

					case CPU::Z80::PartialMachineCycle::Write: {
						if(address == 0xffff && final_slot_->supports_secondary_paging) {
							final_slot_->set_secondary_paging(*cycle.value);
							update_paging();
							break;
						}

						const int slot_hit = (primary_slots_ >> ((address >> 14) * 2)) & 3;
						if(memory_slots_[slot_hit].handler) {
							update_audio();
							memory_slots_[slot_hit].handler->run_for(memory_slots_[slot_hit].cycles_since_update.template flush<HalfCycles>());
							memory_slots_[slot_hit].handler->write(
								address,
								*cycle.value,
								read_pointers_[pc_address_ >> 13] != memory_slots_[0].read_pointer(pc_address_ >> 13));
						} else {
							write_pointers_[address >> 13][address & 8191] = *cycle.value;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Input:
						switch(address & 0xff) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								*cycle.value = vdp_->read(address);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa2:
								update_audio();
								*cycle.value = GI::AY38910::Utility::read(speaker_.ay);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								*cycle.value = i8255_.read(address);
							break;

							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								*cycle.value = clock_.read(next_clock_register_);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff:
								if constexpr (model != Target::Model::MSX1) {
									*cycle.value = ram_mapper_[(address & 0xff) - 0xfc];
									break;
								}
								[[fallthrough]];

							default:
//								printf("Unhandled read %02x\n", address & 0xff);
								*cycle.value = 0xff;
							break;
						}
					break;

					case CPU::Z80::PartialMachineCycle::Output: {
						const int port = address & 0xff;
						switch(port) {
							case 0x9a:	case 0x9b:
								if constexpr (vdp_model() == TI::TMS::TMS9918A) {
									break;
								}
								[[fallthrough]];
							case 0x98:	case 0x99:
								vdp_->write(address, *cycle.value);
								z80_.set_interrupt_line(vdp_->get_interrupt_line());
							break;

							case 0xa0:	case 0xa1:
								update_audio();
								GI::AY38910::Utility::write(speaker_.ay, port == 0xa1, *cycle.value);
							break;

							case 0xa8:	case 0xa9:
							case 0xaa:	case 0xab:
								i8255_.write(address, *cycle.value);
							break;

							case 0xb4:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								next_clock_register_ = *cycle.value;
							break;
							case 0xb5:
								if constexpr (model == Target::Model::MSX1) {
									break;
								}
								clock_.write(next_clock_register_, *cycle.value);
							break;

							case 0xfc: case 0xfd: case 0xfe: case 0xff: {
								if constexpr (model == Target::Model::MSX1) {
									break;
								}

								ram_mapper_[port - 0xfc] = *cycle.value;

								// Apply to RAM.
								//
								// On a real MSX this may also affect other slots.
								// I've not yet needed it to propagate further, so
								// have not implemented any onward route.
								const uint16_t region = uint16_t((port - 0xfc) << 14);
								const size_t base = size_t(*cycle.value) << 14;
								if(base < RAMSize) {
									ram_slot().template map<MemorySlot::AccessType::ReadWrite>(base, region, 0x4000);
								} else {
									ram_slot().unmap(region, 0x4000);
								}

								update_paging();
							} break;

							case 0x7c:	case 0x7d:
								if constexpr (has_opll) {
									speaker_.opll.write(address, *cycle.value);
									break;
								}
								[[fallthrough]];

							default:
								printf("Unhandled write %02x of %02x\n", address & 0xff, *cycle.value);
							break;
						}
					} break;

					case CPU::Z80::PartialMachineCycle::Interrupt:
						*cycle.value = 0xff;

						// Take this as a convenient moment to jump into the keyboard buffer, if desired.
						if(!input_text_.empty()) {
							// The following are KEYBUF per the Red Book; its address and its definition as DEFS 40.
							const int buffer_start = 0xfbf0;
							const int buffer_size = 40;

							// Also from the Red Book: GETPNT is at F3FAH and PUTPNT is at F3F8H.
							int read_address = ram()[0xf3fa] | (ram()[0xf3fb] << 8);
							int write_address = ram()[0xf3f8] | (ram()[0xf3f9] << 8);

							// Write until either the string is exhausted or the write_pointer is immediately
							// behind the read pointer; temporarily map write_address and read_address into
							// buffer-relative values.
							std::size_t characters_written = 0;
							write_address -= buffer_start;
							read_address -= buffer_start;
							while(characters_written < input_text_.size()) {
								const int next_write_address = (write_address + 1) % buffer_size;
								if(next_write_address == read_address) break;
								ram()[write_address + buffer_start] = uint8_t(input_text_[characters_written]);
								++characters_written;
								write_address = next_write_address;
							}
							input_text_.erase(input_text_.begin(), input_text_.begin() + std::string::difference_type(characters_written));

							// Map the write address back into absolute terms and write it out again as PUTPNT.
							write_address += buffer_start;
							ram()[0xf3f8] = uint8_t(write_address);
							ram()[0xf3f9] = uint8_t(write_address >> 8);
						}
					break;

					default: break;
				}
			}

			if(!tape_player_is_sleeping_)
				tape_player_.run_for(int(cycle.length.as_integral()));

			return addition;
		}